

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManTransferMapping(Gia_Man_t *p,Gia_Man_t *pGia)

{
  Vec_Int_t **p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int Fill;
  int Id;
  long lVar7;
  
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    return;
  }
  Gia_ManMappingVerify(pGia);
  p_00 = &p->vMapping;
  Vec_IntFreeP(p_00);
  pVVar4 = Vec_IntAlloc(p->nObjs * 2);
  p->vMapping = pVVar4;
  Vec_IntFill(pVVar4,p->nObjs,Fill);
  Id = 1;
  do {
    if (pGia->nObjs <= Id) {
      Gia_ManMappingVerify(p);
      return;
    }
    iVar1 = Gia_ObjIsLut(pGia,Id);
    if (iVar1 != 0) {
      pGVar5 = Gia_ManObj(pGia,Id);
      iVar1 = Abc_LitIsCompl(pGVar5->Value);
      if (iVar1 != 0) {
        __assert_fail("!Abc_LitIsCompl(Gia_ObjValue(Gia_ManObj(pGia, i)))",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x7ea,"void Gia_ManTransferMapping(Gia_Man_t *, Gia_Man_t *)");
      }
      pGVar5 = Gia_ManObj(pGia,Id);
      iVar1 = Abc_Lit2Var(pGVar5->Value);
      pGVar5 = Gia_ManObj(p,iVar1);
      pVVar4 = p->vMapping;
      iVar1 = Gia_ObjId(p,pGVar5);
      Vec_IntWriteEntry(pVVar4,iVar1,p->vMapping->nSize);
      pVVar4 = p->vMapping;
      iVar1 = Gia_ObjLutSize(pGia,Id);
      Vec_IntPush(pVVar4,iVar1);
      lVar7 = 0;
      while( true ) {
        iVar1 = Gia_ObjLutSize(pGia,Id);
        if (iVar1 <= lVar7) break;
        piVar6 = Gia_ObjLutFanins(pGia,Id);
        pVVar4 = *p_00;
        pGVar5 = Gia_ManObj(pGia,piVar6[lVar7]);
        iVar1 = Abc_Lit2Var(pGVar5->Value);
        Vec_IntPush(pVVar4,iVar1);
        lVar7 = lVar7 + 1;
      }
      iVar2 = Gia_ObjLutMuxId(pGia,Id);
      iVar1 = -iVar2;
      if (0 < iVar2) {
        iVar1 = iVar2;
      }
      pGVar5 = Gia_ManObj(pGia,iVar1);
      iVar2 = Abc_Lit2Var(pGVar5->Value);
      pVVar4 = *p_00;
      iVar3 = Gia_ObjLutIsMux(pGia,Id);
      iVar1 = -iVar2;
      if (iVar3 == 0) {
        iVar1 = iVar2;
      }
      Vec_IntPush(pVVar4,iVar1);
    }
    Id = Id + 1;
  } while( true );
}

Assistant:

void Gia_ManTransferMapping( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Gia_Obj_t * pObj;
    int i, k, iFan;
    if ( !Gia_ManHasMapping(pGia) )
        return;
    Gia_ManMappingVerify( pGia );
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntAlloc( 2 * Gia_ManObjNum(p) );
    Vec_IntFill( p->vMapping, Gia_ManObjNum(p), 0 );
    Gia_ManForEachLut( pGia, i )
    {
        assert( !Abc_LitIsCompl(Gia_ObjValue(Gia_ManObj(pGia, i))) );
        pObj = Gia_ManObj( p, Abc_Lit2Var(Gia_ObjValue(Gia_ManObj(pGia, i))) );
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Gia_ObjLutSize(pGia, i) );
        Gia_LutForEachFanin( pGia, i, iFan, k )
            Vec_IntPush( p->vMapping, Abc_Lit2Var(Gia_ObjValue(Gia_ManObj(pGia, iFan))) );
        iFan = Abc_Lit2Var( Gia_ObjValue(Gia_ManObj(pGia, Abc_AbsInt(Gia_ObjLutMuxId(pGia, i)))) );
        Vec_IntPush( p->vMapping, Gia_ObjLutIsMux(pGia, i) ? -iFan : iFan );
    }
    Gia_ManMappingVerify( p );
}